

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
          (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *this,
          bool free)

{
  byte bVar1;
  byte in_SIL;
  undefined8 in_RDI;
  bool dealloc;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  dealloc = SUB81((ulong)in_RDI >> 0x38,0);
  vec<Minisat::vec<unsigned_int>_>::clear
            ((vec<Minisat::vec<unsigned_int>_> *)
             (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),dealloc);
  vec<char>::clear((vec<char> *)CONCAT17(bVar1,in_stack_fffffffffffffff0),dealloc);
  vec<int>::clear((vec<int> *)CONCAT17(bVar1,in_stack_fffffffffffffff0),dealloc);
  return;
}

Assistant:

void clear(bool free = true)
    {
        occs.clear(free);
        dirty.clear(free);
        dirties.clear(free);
    }